

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall AdaptorSignature_Decrypt_Test::TestBody(AdaptorSignature_Decrypt_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b0;
  Message local_a8;
  string local_a0;
  string local_80;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  undefined1 local_40 [8];
  ByteData normalized_compact_sig;
  ByteData sig;
  AdaptorSignature_Decrypt_Test *this_local;
  
  cfd::core::AdaptorSignature::Decrypt
            ((ByteData *)
             &normalized_compact_sig.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&adaptor_sig2,&secret);
  cfd::core::CryptoUtil::NormalizeSignature((ByteData *)local_40,&compact_sig);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_80,(ByteData *)local_40);
  cfd::core::ByteData::GetHex_abi_cxx11_
            (&local_a0,
             (ByteData *)
             &normalized_compact_sig.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_60,"normalized_compact_sig.GetHex()","sig.GetHex()",&local_80,
             &local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  cfd::core::ByteData::~ByteData((ByteData *)local_40);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &normalized_compact_sig.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(AdaptorSignature, Decrypt) {
  auto sig = adaptor_sig2.Decrypt(secret);

  auto normalized_compact_sig = CryptoUtil::NormalizeSignature(compact_sig);
  EXPECT_EQ(normalized_compact_sig.GetHex(), sig.GetHex());
}